

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

BIND_FLAGS Diligent::SwapChainUsageFlagsToBindFlags(SWAP_CHAIN_USAGE_FLAGS SwapChainUsage)

{
  BIND_FLAGS BVar1;
  SWAP_CHAIN_USAGE_FLAGS SVar2;
  bool bVar3;
  string msg;
  string local_50;
  
  if (SwapChainUsage == SWAP_CHAIN_USAGE_NONE) {
    BVar1 = BIND_NONE;
  }
  else {
    BVar1 = BIND_NONE;
    do {
      SVar2 = -SwapChainUsage & SwapChainUsage;
      switch(SVar2) {
      case SWAP_CHAIN_USAGE_RENDER_TARGET:
        BVar1 = BVar1 | BIND_RENDER_TARGET;
        break;
      case SWAP_CHAIN_USAGE_SHADER_RESOURCE:
        BVar1 = BVar1 | BIND_SHADER_RESOURCE;
        break;
      default:
        FormatString<char[33]>(&local_50,(char (*) [33])"Unexpected swap chain usage flag");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"SwapChainUsageFlagsToBindFlags",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                   ,0x762);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        break;
      case SWAP_CHAIN_USAGE_INPUT_ATTACHMENT:
        BVar1 = BVar1 | BIND_INPUT_ATTACHMENT;
        break;
      case SWAP_CHAIN_USAGE_COPY_SOURCE:
        break;
      }
      bVar3 = SVar2 != SwapChainUsage;
      SwapChainUsage = SVar2 ^ SwapChainUsage;
    } while (bVar3);
  }
  return BVar1;
}

Assistant:

BIND_FLAGS SwapChainUsageFlagsToBindFlags(SWAP_CHAIN_USAGE_FLAGS SwapChainUsage)
{
    BIND_FLAGS BindFlags = BIND_NONE;
    static_assert(SWAP_CHAIN_USAGE_LAST == 8, "Did you add a new swap chain usage flag? Please handle it here.");
    while (SwapChainUsage != SWAP_CHAIN_USAGE_NONE)
    {
        SWAP_CHAIN_USAGE_FLAGS SCUsageBit = ExtractLSB(SwapChainUsage);
        switch (SCUsageBit)
        {
            case SWAP_CHAIN_USAGE_RENDER_TARGET:
                BindFlags |= BIND_RENDER_TARGET;
                break;

            case SWAP_CHAIN_USAGE_SHADER_RESOURCE:
                BindFlags |= BIND_SHADER_RESOURCE;
                break;

            case SWAP_CHAIN_USAGE_INPUT_ATTACHMENT:
                BindFlags |= BIND_INPUT_ATTACHMENT;
                break;

            case SWAP_CHAIN_USAGE_COPY_SOURCE:
                // No special bind flag needed
                break;

            default:
                UNEXPECTED("Unexpected swap chain usage flag");
        }
    }
    return BindFlags;
}